

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void os_strsc(char *p)

{
  osgen_txtwin_t *win;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong __n;
  int iVar5;
  char acStack_78 [72];
  
  win = S_status_win;
  if (p != (char *)0x0) {
    sVar2 = strlen(p);
    sVar3 = 0x86;
    if (sVar2 < 0x86) {
      sVar3 = sVar2;
    }
    memcpy(S_scorebuf,p,sVar3);
    S_scorebuf[sVar3] = '\0';
    osgen_update_stat_right();
    return;
  }
  if (S_stat_reset_free != (char *)0x0 && S_status_win != (osgen_txtwin_t *)0x0) {
    S_status_win->txtfree = S_stat_reset_free;
    iVar1 = S_stat_reset_x;
    (win->base).x = S_stat_reset_x;
    iVar4 = (int)(win->base).wid;
    iVar5 = iVar4 - iVar1;
    if (iVar1 <= iVar4) {
      sVar3 = strlen(S_scorebuf);
      iVar4 = (int)sVar3 + 1;
      if (iVar4 < iVar5) {
        do {
          __n = ~sVar3 + (long)iVar5;
          if (0x3e < __n) {
            __n = 0x3f;
          }
          memset(acStack_78,0x20,__n);
          ossaddsb(win,acStack_78,__n,1);
          iVar5 = iVar5 - (int)__n;
        } while (iVar4 < iVar5);
      }
      else {
        ossaddsb(win," ",1,1);
      }
      sVar3 = strlen(S_scorebuf);
      ossaddsb(win,S_scorebuf,sVar3,1);
      return;
    }
  }
  return;
}

Assistant:

void os_strsc(const char *p)
{
    size_t copy_len;

    /* copy the score, if a value was given */
    if (p != 0)
    {
        /* limit the copying length to our buffer size */
        copy_len = strlen(p);
        if (copy_len > sizeof(S_scorebuf) - 1)
            copy_len = sizeof(S_scorebuf) - 1;
        
        /* copy the text and null-terminate it */
        memcpy(S_scorebuf, p, copy_len);
        S_scorebuf[copy_len] = '\0';
    }

    /* update the statusline window */
    osgen_update_stat_right();
}